

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastPrintMatrix(Gia_Man_t *p,Vec_Wec_t *vProds,int fVerbose)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Wrd_t *vTemp;
  word *__s;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  word Truth;
  word local_38;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  iVar2 = p->nObjs;
  vTemp = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar4 = iVar2;
  }
  vTemp->nCap = iVar4;
  uVar7 = 0;
  if (iVar4 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar4 << 3);
  }
  vTemp->pArray = __s;
  vTemp->nSize = iVar2;
  memset(__s,0,(long)iVar2 << 3);
  uVar5 = vProds->nSize;
  if (0 < (int)uVar5) {
    lVar10 = 0;
    do {
      pVVar1 = vProds->pArray;
      iVar2 = pVVar1[lVar10].nSize;
      if (0 < iVar2) {
        lVar9 = 0;
        do {
          if (pVVar1[lVar10].pArray[lVar9] < 0) goto LAB_0089ecc7;
          uVar7 = (uint)pVVar1[lVar10].pArray[lVar9] >> 1;
          if (p->nObjs <= (int)uVar7) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if ((~*(uint *)(p->pObjs + uVar7) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(p->pObjs + uVar7)) {
            if (0 < (long)p_00->nSize) {
              lVar8 = 0;
              do {
                if (p_00->pArray[lVar8] == uVar7) goto LAB_0089ea36;
                lVar8 = lVar8 + 1;
              } while (p_00->nSize != lVar8);
            }
            Vec_IntPush(p_00,uVar7);
            iVar2 = pVVar1[lVar10].nSize;
          }
LAB_0089ea36:
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar2);
        uVar5 = vProds->nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)uVar5);
    if ((int)uVar5 < 1) {
      uVar7 = 0;
    }
    else {
      lVar10 = 0;
      uVar7 = 0;
      do {
        uVar7 = uVar7 + *(int *)((long)&vProds->pArray->nSize + lVar10);
        lVar10 = lVar10 + 0x10;
      } while ((ulong)uVar5 << 4 != lVar10);
    }
  }
  uVar5 = p_00->nSize;
  printf("Booth partial products: %d pps, %d unique, %d nodes.\n",(ulong)uVar7,(ulong)uVar5,
         (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
  printf("Vector has %d entries: {");
  if (0 < (long)(int)uVar5) {
    uVar6 = 0;
    do {
      printf(" %d");
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(long)(int)uVar5);
  }
  puts(" }");
  if ((fVerbose != 0) && (iVar2 = vProds->nSize, 0 < iVar2)) {
    lVar10 = 0;
    do {
      pVVar1 = vProds->pArray;
      if (0 < pVVar1[lVar10].nSize) {
        uVar6 = 0;
        do {
          uVar7 = pVVar1[lVar10].pArray[uVar6];
          if ((int)uVar7 < 0) {
LAB_0089ecc7:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          printf("Obj = %4d : ",(ulong)(uVar7 >> 1));
          printf("Compl = %d  ",(ulong)(uVar7 & 1));
          printf("Rank = %2d  ",lVar10);
          local_38 = Gia_ObjComputeTruth6Cis(p,uVar7,p_00,vTemp);
          Extra_PrintHex(_stdout,(uint *)&local_38,p_00->nSize);
          iVar2 = p_00->nSize;
          if (iVar2 == 4) {
            printf("    ");
            iVar2 = p_00->nSize;
          }
          if (iVar2 == 3) {
            printf("      ");
            iVar2 = p_00->nSize;
          }
          if (iVar2 < 3) {
            printf("       ");
          }
          printf("  ");
          printf("Vector has %d entries: {",(ulong)(uint)p_00->nSize);
          if (0 < p_00->nSize) {
            lVar9 = 0;
            do {
              printf(" %d",(ulong)(uint)p_00->pArray[lVar9]);
              lVar9 = lVar9 + 1;
            } while (lVar9 < p_00->nSize);
          }
          puts(" }");
          iVar2 = pVVar1[lVar10].nSize;
          if (uVar6 == iVar2 - 1) {
            putchar(10);
            iVar2 = pVVar1[lVar10].nSize;
          }
          uVar6 = uVar6 + 1;
        } while ((long)uVar6 < (long)iVar2);
        iVar2 = vProds->nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar2);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (vTemp->pArray != (word *)0x0) {
    free(vTemp->pArray);
  }
  free(vTemp);
  return;
}

Assistant:

void Wlc_BlastPrintMatrix( Gia_Man_t * p, Vec_Wec_t * vProds, int fVerbose )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;  word Truth;
    int i, k, iLit; 
    Vec_WecForEachLevel( vProds, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
            if ( Gia_ObjIsAnd(Gia_ManObj(p, Abc_Lit2Var(iLit))) )
                Vec_IntPushUnique( vSupp, Abc_Lit2Var(iLit) );
    printf( "Booth partial products: %d pps, %d unique, %d nodes.\n", 
        Vec_WecSizeSize(vProds), Vec_IntSize(vSupp), Gia_ManAndNum(p) );
    Vec_IntPrint( vSupp );

    if ( fVerbose )
    Vec_WecForEachLevel( vProds, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            printf( "Obj = %4d : ", Abc_Lit2Var(iLit) );
            printf( "Compl = %d  ", Abc_LitIsCompl(iLit) );
            printf( "Rank = %2d  ", i );
            Truth = Gia_ObjComputeTruth6Cis( p, iLit, vSupp, vTemp );
            Extra_PrintHex( stdout, (unsigned*)&Truth, Vec_IntSize(vSupp) );
            if ( Vec_IntSize(vSupp) == 4 ) printf( "    " );
            if ( Vec_IntSize(vSupp) == 3 ) printf( "      " );
            if ( Vec_IntSize(vSupp) <= 2 ) printf( "       " );
            printf( "  " );
            Vec_IntPrint( vSupp );
            if ( k == Vec_IntSize(vLevel)-1 )
                printf( "\n" );
        }
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
}